

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O1

void __thiscall adios2::core::engine::InlineWriter::EndStep(InlineWriter *this)

{
  int iVar1;
  ostream *poVar2;
  ScopedTimer __var2157;
  ScopedTimer local_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (EndStep()::__var157 == '\0') {
    iVar1 = __cxa_guard_acquire(&EndStep()::__var157);
    if (iVar1 != 0) {
      EndStep::__var157 = (void *)ps_timer_create_("InlineWriter::EndStep");
      __cxa_guard_release(&EndStep()::__var157);
    }
  }
  local_b0.m_timer = EndStep::__var157;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  if (this->m_InsideStep == false) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"InlineWriter","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"EndStep","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "InlineWriter::EndStep() cannot be called without a call to BeginStep() first","");
    helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if (this->m_Verbosity == 5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inline Writer ",0xe);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->m_WriterRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," EndStep() Step ",0x10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  this->m_InsideStep = false;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_b0);
  return;
}

Assistant:

void InlineWriter::EndStep()
{
    PERFSTUBS_SCOPED_TIMER("InlineWriter::EndStep");
    if (!m_InsideStep)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineWriter", "EndStep",
                                          "InlineWriter::EndStep() cannot be called "
                                          "without a call to BeginStep() first");
    }
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Writer " << m_WriterRank << " EndStep() Step " << m_CurrentStep
                  << std::endl;
    }
    m_InsideStep = false;
}